

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<std::pair<QObject*,QByteArray>,QPropertyAnimation*>>::
findNode<std::pair<QObject*,QByteArray>>
          (Data<QHashPrivate::Node<std::pair<QObject*,QByteArray>,QPropertyAnimation*>> *this,
          pair<QObject_*,_QByteArray> *key)

{
  ulong uVar1;
  Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*> *pNVar2;
  Bucket BVar3;
  
  BVar3 = findBucket<std::pair<QObject*,QByteArray>>(this,key);
  uVar1 = (ulong)(BVar3.span)->offsets[BVar3.index];
  if (uVar1 == 0xff) {
    pNVar2 = (Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*> *)0x0;
  }
  else {
    pNVar2 = (Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*> *)
             ((BVar3.span)->entries + uVar1);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }